

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O3

void __thiscall
JsrtExternalObject::JsrtExternalObject
          (JsrtExternalObject *this,JsrtExternalType *type,void *data,uint inlineSlotSize)

{
  Js::DynamicObject::DynamicObject(&this->super_DynamicObject,&type->super_DynamicType,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014d08a0;
  this->initialized = true;
  this->u = (Type)0x0;
  if (inlineSlotSize == 0) {
    this->slotType = External;
    Memory::Recycler::WBSetBit((char *)&(this->u).inlineSlotSize);
    this->u = (Type)data;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->u);
    return;
  }
  this->slotType = Inline;
  (this->u).inlineSlotSize = inlineSlotSize;
  if (data != (void *)0x0) {
    memcpy_s(this + 1,(ulong)inlineSlotSize,data,(ulong)inlineSlotSize);
    return;
  }
  return;
}

Assistant:

JsrtExternalObject::JsrtExternalObject(JsrtExternalType * type, void *data, uint inlineSlotSize) :
    Js::DynamicObject(type, true /* initSlots*/)
{
    if (inlineSlotSize != 0)
    {
        this->slotType = SlotType::Inline;
        this->u.inlineSlotSize = inlineSlotSize;
        if (data)
        {
            memcpy_s(this->GetInlineSlots(), inlineSlotSize, data, inlineSlotSize);
        }
    }
    else
    {
        this->slotType = SlotType::External;
        this->u.slot = data;
    }
}